

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::anon_unknown_39::findThisHandle
                   (Scope *scope,bitmask<slang::ast::LookupFlags> flags,SourceRange range,
                   LookupResult *result)

{
  SourceRange sourceRange;
  bool bVar1;
  Scope *this;
  Symbol *this_00;
  ConstraintBlockSymbol *pCVar2;
  ClassType *pCVar3;
  Scope *in_RDI;
  VariableSymbol *thisVar;
  SubroutineSymbol *sub;
  Scope *parentScope_1;
  Symbol *parent_1;
  Scope *parentScope;
  Symbol *parent;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff7f;
  bitmask<slang::ast::LookupFlags> *in_stack_ffffffffffffff80;
  bitmask<slang::ast::LookupFlags> in_stack_ffffffffffffff94;
  LookupResult *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  SourceLocation in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  DiagCode code;
  Symbol *local_40;
  bitmask<slang::ast::LookupFlags> local_34 [3];
  Scope *local_28;
  
  local_28 = in_RDI;
  bitmask<slang::ast::LookupFlags>::bitmask(local_34,TypeReference);
  bVar1 = bitmask<slang::ast::LookupFlags>::has
                    (in_stack_ffffffffffffff80,
                     (bitmask<slang::ast::LookupFlags> *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78)
                                      )));
  if (bVar1) {
    local_40 = Scope::asSymbol(local_28);
    while( true ) {
      code = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
      bVar1 = false;
      if (local_40->kind != ClassType) {
        bVar1 = local_40->kind != InstanceBody;
      }
      if (!bVar1) break;
      this = Symbol::getParentScope(local_40);
      code = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
      if (this == (Scope *)0x0) break;
      local_40 = Scope::asSymbol(this);
    }
    if (local_40->kind == ClassType) {
      pCVar3 = Symbol::as<slang::ast::ClassType>((Symbol *)0x64e49c);
      return (Symbol *)pCVar3;
    }
  }
  else {
    this_00 = Scope::asSymbol(local_28);
    while( true ) {
      uVar5 = true;
      if (this_00->kind != StatementBlock) {
        uVar5 = this_00->kind == RandSeqProduction;
      }
      if ((bool)uVar5 == false) break;
      in_stack_ffffffffffffffa8 = (SourceLocation)Symbol::getParentScope(this_00);
      this_00 = Scope::asSymbol((Scope *)in_stack_ffffffffffffffa8);
    }
    if (this_00->kind == Subroutine) {
      in_stack_ffffffffffffffa0 =
           (SourceLocation)Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x64e51c);
      code = SUB84((ulong)this_00 >> 0x20,0);
      if (*(long *)((long)in_stack_ffffffffffffffa0 + 0xd8) != 0) {
        return *(Symbol **)((long)in_stack_ffffffffffffffa0 + 0xd8);
      }
    }
    else if (this_00->kind == ConstraintBlock) {
      pCVar2 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x64e562);
      code = SUB84((ulong)this_00 >> 0x20,0);
      if (pCVar2->thisVar != (VariableSymbol *)0x0) {
        return (Symbol *)pCVar2->thisVar;
      }
      in_stack_ffffffffffffff98 = (LookupResult *)0x0;
    }
    else {
      bVar4 = 0;
      if (this_00->kind == ClassType) {
        bitmask<slang::ast::LookupFlags>::bitmask
                  ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffff94,StaticInitializer);
        bVar1 = bitmask<slang::ast::LookupFlags>::has
                          (in_stack_ffffffffffffff80,
                           (bitmask<slang::ast::LookupFlags> *)
                           CONCAT17(in_stack_ffffffffffffff7f,
                                    CONCAT16(uVar5,CONCAT15(bVar4,in_stack_ffffffffffffff78))));
        bVar4 = bVar1 ^ 0xff;
      }
      code = SUB84((ulong)this_00 >> 0x20,0);
      if ((bVar4 & 1) != 0) {
        pCVar3 = Symbol::as<slang::ast::ClassType>((Symbol *)0x64e5cf);
        return (Symbol *)pCVar3->thisVar;
      }
    }
  }
  sourceRange.endLoc = in_stack_ffffffffffffffa8;
  sourceRange.startLoc = in_stack_ffffffffffffffa0;
  LookupResult::addDiag
            (in_stack_ffffffffffffff98,(Scope *)CONCAT44(in_stack_ffffffffffffff94.m_bits,0x16000a),
             code,sourceRange);
  return (Symbol *)0x0;
}

Assistant:

const Symbol* findThisHandle(const Scope& scope, bitmask<LookupFlags> flags, SourceRange range,
                             LookupResult& result) {
    if (flags.has(LookupFlags::TypeReference)) {
        // type(this) is allowed to work anywhere within a class, regardless of whether
        // it's a static context or not.
        auto parent = &scope.asSymbol();
        while (parent->kind != SymbolKind::ClassType && parent->kind != SymbolKind::InstanceBody) {
            auto parentScope = parent->getParentScope();
            if (!parentScope)
                break;
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::ClassType)
            return &parent->as<ClassType>();
    }
    else {
        // Find the parent method, if we can.
        const Symbol* parent = &scope.asSymbol();
        while (parent->kind == SymbolKind::StatementBlock ||
               parent->kind == SymbolKind::RandSeqProduction) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::Subroutine) {
            auto& sub = parent->as<SubroutineSymbol>();
            if (sub.thisVar)
                return sub.thisVar;
        }
        else if (parent->kind == SymbolKind::ConstraintBlock) {
            auto thisVar = parent->as<ConstraintBlockSymbol>().thisVar;
            if (thisVar)
                return thisVar;
        }
        else if (parent->kind == SymbolKind::ClassType &&
                 !flags.has(LookupFlags::StaticInitializer)) {
            return parent->as<ClassType>().thisVar;
        }
    }

    result.addDiag(scope, diag::InvalidThisHandle, range);
    return nullptr;
}